

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::
ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  string *psVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar2;
  string *in_RCX;
  string_view name;
  string_view element_name;
  string error;
  FileDescriptor *local_68;
  VoidPtr local_60;
  code *pcStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  FileDescriptor **local_30;
  undefined1 **local_28;
  
  psVar1 = file->package_;
  if (psVar1->_M_string_length != 0) {
    local_48 = 0;
    local_40 = 0;
    name._M_str = (char *)&local_50;
    name._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
    local_68 = file;
    local_50 = &local_40;
    bVar2 = anon_unknown_24::IsValidLowerSnakeCaseName
                      ((anon_unknown_24 *)psVar1->_M_string_length,name,in_RCX);
    if (!bVar2) {
      local_30 = &local_68;
      local_60.obj = &local_30;
      pcStack_58 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      make_error.ptr_.obj = local_60.obj;
      element_name._M_str = (local_68->name_->_M_dataplus)._M_p;
      element_name._M_len = local_68->name_->_M_string_length;
      local_28 = &local_50;
      AddError(this,element_name,&proto->super_Message,NAME,make_error);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateNamingStyle(const FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  // Ignore empty packages for style checks.
  if (file->package().empty()) {
    return;
  }
  std::string error;
  if (!IsValidLowerSnakeCaseName(file->package(), &error)) {
    AddError(file->name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("Package name ", file->package(), " ", error,
                          kNamingStyleOptOutMessage);
    });
  }
}